

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(ushort *)&__return_storage_ptr__->field_2 = CONCAT11(stringQuote,stringQuote);
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
    return __return_storage_ptr__;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,"true");
  if ((((iVar5 == 0) ||
       (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(arg,"false"), iVar5 == 0)) ||
      (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(arg,"nan"), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(arg,"inf"), iVar5 == 0)) goto LAB_0018642e;
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,0,2,"0x");
  if ((iVar5 != 0) &&
     (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(arg,0,2,"0X"), iVar5 != 0)) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    bVar4 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_90);
    if ((bVar4) &&
       (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_not_of(arg,"0123456789.-+eE",0,0xf), sVar6 == 0xffffffffffffffff))
    goto LAB_0018642e;
  }
  pbVar2 = (byte *)(arg->_M_dataplus)._M_p;
  sVar6 = arg->_M_string_length;
  if (sVar6 == 1) {
    iVar5 = isprint((uint)*pbVar2);
    if (iVar5 == 0) goto LAB_00186421;
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (arg,"\'");
    if (iVar5 == 0) {
      local_70._M_string_length = 1;
      local_70.field_2._M_local_buf[1] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_local_buf[0] = stringQuote;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_70,"\'");
      local_90._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar9) {
        local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00186611;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = literalQuote;
    ::std::operator+(&local_90,&local_70,arg);
    ::std::operator+(__return_storage_ptr__,&local_90,literalQuote);
    goto LAB_00186593;
  }
  if (*pbVar2 == 0x30) {
    bVar1 = pbVar2[1];
    if (bVar1 == 0x62) {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>>
                        (pbVar2 + 2,pbVar2 + sVar6);
    }
    else if (bVar1 == 0x6f) {
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>>
                        (pbVar2 + 2,pbVar2 + sVar6);
    }
    else {
      if (bVar1 != 0x78) goto LAB_0018640a;
      _Var7 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>>
                        (pbVar2 + 2,pbVar2 + sVar6);
    }
    if ((byte *)_Var7._M_current == pbVar2 + sVar6) {
LAB_0018642e:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (arg->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + arg->_M_string_length);
      return __return_storage_ptr__;
    }
  }
LAB_0018640a:
  pcVar3 = (arg->_M_dataplus)._M_p;
  pcVar10 = pcVar3 + arg->_M_string_length;
  _Var7 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::is_printable(std::__cxx11::string_const&)::_lambda(char)_1_>>
                    (pcVar3,pcVar10);
  if (_Var7._M_current != pcVar10) {
LAB_00186421:
    binary_escape_string(__return_storage_ptr__,arg);
    return __return_storage_ptr__;
  }
  sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(arg,escapedChars_abi_cxx11_,0,DAT_005053b8);
  if (sVar6 == 0xffffffffffffffff) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = stringQuote;
    ::std::operator+(&local_90,&local_70,arg);
    ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
LAB_00186593:
    local_50.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_001865a6:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (100 < arg->_M_string_length && !disable_multi_line) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'\'\'","");
      ::std::operator+(&local_90,&local_70,arg);
      ::std::operator+(__return_storage_ptr__,&local_90,"\'\'\'");
      goto LAB_00186593;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = stringQuote;
    add_escaped_characters(&local_50,arg);
    ::std::operator+(&local_90,&local_70,&local_50);
    ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001865a6;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
LAB_00186611:
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                           CONCAT11(local_70.field_2._M_local_buf[1],
                                    local_70.field_2._M_local_buf[0])) + 1);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}